

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O3

void __thiscall wasm::OnceReduction::run(OnceReduction *this,Module *module)

{
  __node_base_ptr *this_00;
  pointer puVar1;
  Global *__k;
  pointer puVar2;
  pointer puVar3;
  Export *pEVar4;
  size_t sVar5;
  bool bVar6;
  uint uVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var10;
  undefined8 *puVar11;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func_1;
  pointer puVar12;
  uint uVar13;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar14;
  pointer puVar15;
  long *plVar16;
  __int_type_conflict _Var17;
  undefined1 auStack_408 [8];
  mapped_type global_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  Expression **local_3d8;
  size_t sStack_3d0;
  pointer local_328;
  pointer pTStack_320;
  pointer local_318;
  Function *pFStack_310;
  Module *local_308;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_300;
  Expression *local_2c8;
  pointer local_2a8;
  pointer ppEStack_2a0;
  pointer local_298;
  pointer local_280;
  pointer puStack_278;
  pointer local_270;
  pointer ppBStack_268;
  pointer local_260;
  pointer ppBStack_258;
  _Rb_tree_node_base local_240;
  undefined1 local_220 [184];
  _Rb_tree_node_base local_168;
  size_t local_148;
  undefined1 *local_140;
  undefined1 local_130 [8];
  OptInfo optInfo;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_130 = (undefined1  [8])&optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobals._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  optInfo.onceGlobals._M_h._M_bucket_count = 0;
  optInfo.onceGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobals._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobals._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceFuncs._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  optInfo.onceFuncs._M_h._M_bucket_count = 0;
  optInfo.onceFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  puVar14 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar1) {
    do {
      __k = (puVar14->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (((__k->type).id & 0xfffffffffffffffe) == 2) {
        _Var17 = *(char **)((long)&(__k->super_Importable).module + 8) == (char *)0x0;
      }
      else {
        _Var17 = false;
      }
      pmVar8 = std::__detail::
               _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_130,(key_type *)__k);
      LOCK();
      (pmVar8->_M_base)._M_i = _Var17;
      UNLOCK();
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar1);
  }
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (module->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2; puVar12 = puVar12 + 1
      ) {
    pmVar9 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&optInfo.onceGlobals._M_h._M_single_bucket,
                          (key_type *)
                          (puVar12->_M_t).
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    (pmVar9->super_IString).str._M_len = 0;
    (pmVar9->super_IString).str._M_str = (char *)0x0;
  }
  puVar15 = (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar15 != puVar3) {
    do {
      pEVar4 = (puVar15->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar4->kind == Global) {
        pmVar8 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_130,&pEVar4->value);
        LOCK();
        (pmVar8->_M_base)._M_i = false;
        UNLOCK();
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar3);
  }
  global_1.super_IString.str._M_str = (char *)&local_3e8;
  local_3e8._M_local_buf[0] = '\0';
  local_3d8 = (Expression **)0x0;
  sStack_3d0 = 0;
  local_328 = (pointer)0x0;
  pTStack_320 = (pointer)0x0;
  local_318 = (pointer)0x0;
  pFStack_310 = (Function *)0x0;
  local_308 = (Module *)0x0;
  auStack_408 = (undefined1  [8])&PTR__Scanner_00d74bb0;
  _Stack_300._M_buckets = &_Stack_300._M_single_bucket;
  _Stack_300._M_bucket_count = (size_type)&DAT_00000001;
  _Stack_300._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_300._M_element_count = 0;
  _Stack_300._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_300._M_rehash_policy._M_next_resize = 0;
  _Stack_300._M_single_bucket = (__node_base_ptr)0x0;
  local_2c8 = (Expression *)local_130;
  global_1.super_IString.str._M_len = (size_t)(this->super_Pass).runner;
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
         *)auStack_408,module);
  auStack_408 = (undefined1  [8])&PTR__Scanner_00d74bb0;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_300);
  if (local_328 != (pointer)0x0) {
    operator_delete(local_328,(long)local_318 - (long)local_328);
  }
  auStack_408 = (undefined1  [8])&PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)global_1.super_IString.str._M_str != &local_3e8) {
    operator_delete(global_1.super_IString.str._M_str,
                    CONCAT71(local_3e8._M_allocated_capacity._1_7_,local_3e8._M_local_buf[0]) + 1);
  }
  if (optInfo.onceFuncs._M_h._M_bucket_count != 0) {
    plVar16 = (long *)optInfo.onceFuncs._M_h._M_bucket_count;
    do {
      if (plVar16[4] != 0) {
        pmVar8 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_130,(key_type *)(plVar16 + 3));
        if (((pmVar8->_M_base)._M_i & 1U) == 0) {
          (((key_type *)(plVar16 + 3))->super_IString).str._M_len = 0;
          plVar16[4] = 0;
        }
      }
      plVar16 = (long *)*plVar16;
    } while (plVar16 != (long *)0x0);
  }
  this_00 = &optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket;
  puVar12 = (module->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar5 = global_1.super_IString.str._M_len;
  if (puVar12 != puVar2) {
    bVar6 = false;
    do {
      while( true ) {
        p_Var10 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&optInfo.onceFuncs._M_h._M_single_bucket,
                                  (key_type *)
                                  (puVar12->_M_t).
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pmVar9 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&optInfo.onceGlobals._M_h._M_single_bucket,
                              (key_type *)
                              (puVar12->_M_t).
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        auStack_408 = (undefined1  [8])(pmVar9->super_IString).str._M_len;
        global_1.super_IString.str._M_len = (size_t)(pmVar9->super_IString).str._M_str;
        if ((char *)global_1.super_IString.str._M_len != (char *)0x0) break;
        puVar12 = puVar12 + 1;
        if (puVar12 == puVar2) {
          sVar5 = 0;
          if (!bVar6) goto LAB_007d13e8;
          goto LAB_007d127a;
        }
      }
      optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket = (__node_base_ptr)p_Var10;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                (p_Var10,auStack_408,&optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket);
      puVar12 = puVar12 + 1;
      bVar6 = true;
    } while (puVar12 != puVar2);
LAB_007d127a:
    uVar13 = 0;
    do {
      puVar2 = (module->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar12 = (module->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar2;
          puVar12 = puVar12 + 1) {
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)this_00,
                     (key_type *)
                     (puVar12->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      global_1.super_IString.str._M_str = (char *)&local_3e8;
      local_3e8._M_local_buf[0] = '\0';
      local_3d8 = (Expression **)0x0;
      sStack_3d0 = 0;
      local_298 = (pointer)0x0;
      local_2a8 = (pointer)0x0;
      ppEStack_2a0 = (pointer)0x0;
      local_308 = (Module *)0x0;
      _Stack_300._M_buckets = (__node_base_ptr *)0x0;
      local_318 = (pointer)0x0;
      pFStack_310 = (Function *)0x0;
      local_328 = (pointer)0x0;
      pTStack_320 = (pointer)0x0;
      local_240._M_color = _S_red;
      local_240._M_parent = (_Base_ptr)0x0;
      local_260 = (pointer)0x0;
      ppBStack_258 = (pointer)0x0;
      local_270 = (pointer)0x0;
      ppBStack_268 = (pointer)0x0;
      local_280 = (pointer)0x0;
      puStack_278 = (pointer)0x0;
      local_240._M_left = &local_240;
      local_168._M_color = _S_red;
      local_168._M_parent = (_Base_ptr)0x0;
      local_240._M_right = local_240._M_left;
      memset(local_220,0,0xb0);
      local_168._M_left = &local_168;
      local_148 = 0;
      auStack_408 = (undefined1  [8])&PTR__WalkerPass_00d74c08;
      local_140 = local_130;
      global_1.super_IString.str._M_len = (size_t)(this->super_Pass).runner;
      local_168._M_right = local_168._M_left;
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::run((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
             *)auStack_408,module);
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::~WalkerPass((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                     *)auStack_408);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&optInfo.onceFuncs._M_h._M_single_bucket);
      uVar7 = 0;
      for (puVar11 = (undefined8 *)optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count;
          puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
        uVar7 = uVar7 + *(int *)(puVar11 + 6);
      }
      if (uVar7 < uVar13) {
        __assert_fail("currOnceGlobalsSet >= lastOnceGlobalsSet",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OnceReduction.cpp"
                      ,0x1b5,"virtual void wasm::OnceReduction::run(Module *)");
      }
      bVar6 = uVar13 < uVar7;
      uVar13 = uVar7;
      sVar5 = global_1.super_IString.str._M_len;
    } while (bVar6);
  }
LAB_007d13e8:
  global_1.super_IString.str._M_len = sVar5;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this_00);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&optInfo.onceFuncs._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&optInfo.onceGlobals._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_130);
  return;
}

Assistant:

void run(Module* module) override {
    OptInfo optInfo;

    // Fill out the initial data.
    for (auto& global : module->globals) {
      // For a global to possibly be "once", it must be an integer, and to not
      // be imported (as a mutable import may be read and written to from the
      // outside). As we scan code we will turn this into false if we see
      // anything that proves the global is not "once".
      // TODO: This limitation could perhaps only be on mutable ones, but
      //       immutable globals will not be considered "once" anyhow as they do
      //       not fit the pattern of being written after the first call.
      // TODO: non-integer types?
      optInfo.onceGlobals[global->name] =
        global->type.isInteger() && !global->imported();
    }
    for (auto& func : module->functions) {
      // Fill in the map so that it can be operated on in parallel.
      optInfo.onceFuncs[func->name] = Name();
    }
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Global) {
        // An exported global cannot be "once" since the outside may read and
        // write to it in ways we are unaware.
        // TODO: See comment above on mutability.
        optInfo.onceGlobals[ex->value] = false;
      }
    }

    // Scan the module to find out which globals and functions are "once".
    Scanner(optInfo).run(getPassRunner(), module);

    // Combine the information. We found which globals appear to be "once", but
    // other information may have proven they are not so, in fact. Specifically,
    // for a function to be "once" we need its global to also be such.
    for (auto& [_, onceGlobal] : optInfo.onceFuncs) {
      if (onceGlobal.is() && !optInfo.onceGlobals[onceGlobal]) {
        onceGlobal = Name();
      }
    }

    // Optimize using what we found. Keep iterating while we find things to
    // optimize, which we estimate using a counter of the total number of once
    // globals set by functions: as that increases, it means we are propagating
    // useful information.
    // TODO: limit # of iterations?
    Index lastOnceGlobalsSet = 0;

    // First, initialize onceGlobalsSetInFuncs for the first iteration, by
    // ensuring each item is present, and adding the "once" global for "once"
    // funcs.
    bool foundOnce = false;
    for (auto& func : module->functions) {
      // Either way, at least fill the data structure for parallel operation.
      auto& set = optInfo.onceGlobalsSetInFuncs[func->name];

      auto global = optInfo.onceFuncs[func->name];
      if (global.is()) {
        set.insert(global);
        foundOnce = true;
      }
    }

    if (!foundOnce) {
      // Nothing to optimize.
      return;
    }

    while (1) {
      // Initialize all the items in the new data structure that will be
      // populated.
      for (auto& func : module->functions) {
        optInfo.newOnceGlobalsSetInFuncs[func->name];
      }

      Optimizer(optInfo).run(getPassRunner(), module);

      optInfo.onceGlobalsSetInFuncs =
        std::move(optInfo.newOnceGlobalsSetInFuncs);

      // Count how many once globals are set, and see if we have any more work
      // to do.
      Index currOnceGlobalsSet = 0;
      for (auto& [_, globals] : optInfo.onceGlobalsSetInFuncs) {
        currOnceGlobalsSet += globals.size();
      }
      assert(currOnceGlobalsSet >= lastOnceGlobalsSet);
      if (currOnceGlobalsSet > lastOnceGlobalsSet) {
        lastOnceGlobalsSet = currOnceGlobalsSet;
        continue;
      }
      return;
    }
  }